

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::LSR_AC(CPU *this)

{
  byte bVar1;
  
  bVar1 = this->A;
  this->A = bVar1 >> 1;
  this->cycles = 1;
  (this->field_6).ps = (bVar1 < 2) * '\x02' | (this->field_6).ps & 0x7c | bVar1 & 1;
  return;
}

Assistant:

void CPU::LSR_AC()
{
    cycles = 2;
    C = (A & 0b00000001) > 0;
    A >>= 1;
    cycles--;
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}